

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitup.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  strerr *e;
  char *s2;
  char *s1;
  long lVar8;
  tai when;
  tai now;
  char status [18];
  char sulong [40];
  
  progname = *argv;
  bVar3 = true;
LAB_001022ad:
  while (iVar4 = sgetoptmine(argc,argv,"s:vV"), iVar4 != subgetoptdone) {
    if (iVar4 == 0x3f) goto LAB_0010231e;
    if (iVar4 == 0x56) {
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
      goto LAB_0010231e;
    }
    if (iVar4 == 0x73) goto LAB_001022fd;
    if (iVar4 == 0x76) {
      bVar3 = false;
    }
  }
  lVar8 = (long)subgetoptind;
  if (argv[lVar8] == (char *)0x0) {
    usage();
  }
  ppcVar1 = argv + lVar8;
  iVar4 = open_read(".");
  ppcVar2 = ppcVar1;
  if (iVar4 == -1) {
    fatal("unable to open current working directory");
  }
LAB_00102376:
  do {
    dir = ppcVar2;
    if (*dir == (char *)0x0) {
      iVar5 = fchdir(iVar4);
      if (iVar5 == -1) {
        strerr_warn("svwaitup: warning: ","unable to switch to starting directory: ",(char *)0x0,
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      close(iVar4);
      if (100 < rc) {
        rc = 100;
      }
      _exit(rc);
    }
    if ((dir != ppcVar1) && (iVar5 = fchdir(iVar4), iVar5 == -1)) {
      fatal("unable to switch to starting directory");
    }
    iVar5 = chdir(*dir);
    if (iVar5 == -1) {
      s1 = *dir;
      s2 = ": unable to change directory: ";
LAB_001024c5:
      e = &strerr_sys;
    }
    else {
      iVar5 = open_write("supervise/ok");
      if (iVar5 == -1) {
        piVar7 = __errno_location();
        s1 = *dir;
        if (*piVar7 != error_nodevice) {
          s2 = ": unable to open supervise/ok: ";
          goto LAB_001024c5;
        }
        s2 = ": runsv not running.";
      }
      else {
        close(iVar5);
        iVar5 = open_read("supervise/status");
        if (iVar5 == -1) {
          s1 = *dir;
          s2 = "unable to open supervise/status: ";
          goto LAB_001024c5;
        }
        uVar6 = buffer_unixread(iVar5,status,0x12);
        close(iVar5);
        if (uVar6 < 0x12) {
          s1 = *dir;
          s2 = ": unable to read supervise/status: bad format.";
        }
        else {
          if (status._12_4_ != 0) {
            tai_unpack(status,&when);
            tai_now(&now);
            if (now.x < when.x) {
              when = now;
            }
            tai_sub(&when,&now,&when);
            iVar5 = (int)when.x;
            if ((ulong)(long)iVar5 < sec) {
              sleep((int)sec - iVar5);
              ppcVar2 = dir;
            }
            else {
              if (!bVar3) {
                uVar6 = fmt_ulong(sulong,(long)iVar5);
                sulong[uVar6] = '\0';
                strerr_warn("svwaitup: ",*dir,": is up (",sulong," seconds)",(char *)0x0,
                            (strerr *)0x0);
              }
              dir = dir + 1;
              ppcVar2 = dir;
            }
            goto LAB_00102376;
          }
          s1 = *dir;
          s2 = ": is down.";
        }
      }
      e = (strerr *)0x0;
    }
    warn(s1,s2,e);
    ppcVar2 = dir;
  } while( true );
LAB_001022fd:
  scan_ulong(subgetoptarg,&sec);
  if (sec - 0x259 < 0xfffffffffffffda8) {
LAB_0010231e:
    usage();
  }
  goto LAB_001022ad;
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  int verbose =0;
  char status[18];
  int fd;
  int is;
  int r;
  int wdir;
  unsigned long pid;
  struct tai when;
  struct tai now;
  char sulong[FMT_ULONG];

  progname =*argv;

  while ((opt =getopt(argc, argv, "s:vV")) != opteof) {
    switch(opt) {
    case 's':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 600)) usage();
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  dir =argv;
  while (*dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice)
        warn(*dir, ": runsv not running.", 0);
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, sizeof status);
    close(fd);
    if (r < sizeof status) {
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }

    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];
    if (! pid) {
      warn(*dir, ": is down.", 0);
      continue;
    }

    tai_unpack(status, &when);
    tai_now(&now);
    if (tai_less(&now, &when)) when =now;
    tai_sub(&when, &now, &when);
    is =tai_approx(&when);

    if (is >= sec) {
      /* ok */
      if (verbose) {
        sulong[fmt_ulong(sulong, is)] =0;
        strerr_warn5(INFO, *dir, ": is up (", sulong, " seconds)", 0);
      }
      dir++;
      continue;
    }
    sleep(sec -is);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}